

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestPlusCompare(void)

{
  Bignum c;
  Bignum b;
  Bignum a;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  Bignum *in_stack_fffffffffffff9f0;
  Chunk in_stack_fffffffffffff9fc;
  Bignum *in_stack_fffffffffffffa00;
  Chunk in_stack_fffffffffffffa08;
  Chunk in_stack_fffffffffffffa0c;
  Bignum *in_stack_fffffffffffffa10;
  Bignum *in_stack_fffffffffffffa18;
  Bignum *in_stack_fffffffffffffa20;
  Bignum *in_stack_fffffffffffffa28;
  Bignum local_408;
  Bignum local_204;
  
  double_conversion::Bignum::Bignum(&local_204);
  double_conversion::Bignum::Bignum(&local_408);
  double_conversion::Bignum::Bignum((Bignum *)&stack0xfffffffffffff9f4);
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusEqual
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x827173);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::PlusLessEqual
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x8271ab);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::PlusLess
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x8271e3);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusEqual
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x8272cc);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::PlusEqual
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x827306);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::PlusLessEqual
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x827340);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::PlusLessEqual
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x827378);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::PlusLess
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x8273b2);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  double_conversion::Bignum::PlusLess
            (in_stack_fffffffffffff9f0,
             (Bignum *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
             (Bignum *)0x8273ea);
  CheckHelper((char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::AssignUInt16
            (in_stack_fffffffffffffa00,(uint16_t)(in_stack_fffffffffffff9fc >> 0x10));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::PlusCompare
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9fc,
                    (char *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  return;
}

Assistant:

TEST(PlusCompare) {
  Bignum a;
  Bignum b;
  Bignum c;
  a.AssignUInt16(1);
  b.AssignUInt16(0);
  c.AssignUInt16(1);
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));
  CHECK(Bignum::PlusEqual(a, b, c));
  CHECK(Bignum::PlusLessEqual(a, b, c));
  CHECK(!Bignum::PlusLess(a, b, c));

  a.AssignUInt16(0);
  b.AssignUInt16(0);
  c.AssignUInt16(1);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));
  CHECK_EQ(+1, Bignum::PlusCompare(c, b, a));
  CHECK(!Bignum::PlusEqual(a, b, c));
  CHECK(!Bignum::PlusEqual(c, b, a));
  CHECK(Bignum::PlusLessEqual(a, b, c));
  CHECK(!Bignum::PlusLessEqual(c, b, a));
  CHECK(Bignum::PlusLess(a, b, c));
  CHECK(!Bignum::PlusLess(c, b, a));

  AssignHexString(&a, "1234567890ABCDEF12345");
  b.AssignUInt16(1);
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(+1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890ABCDEF12344");
  b.AssignUInt16(1);
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12344");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12346");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450001");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(+1, Bignum::PlusCompare(a, b, c));
}